

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqobject.cpp
# Opt level: O0

bool __thiscall SQGenerator::Yield(SQGenerator *this,SQVM *v,SQInteger target)

{
  CallInfo *this_00;
  SQObjectPtr *pSVar1;
  SQWeakRef *x;
  SQExceptionTrap *pSVar2;
  SQExceptionTrap *val;
  long in_RDX;
  SQVM *in_RSI;
  long in_RDI;
  bool bVar3;
  SQExceptionTrap *et;
  SQInteger i;
  SQInteger j;
  SQInteger n;
  SQObject _this;
  SQInteger size;
  CallInfo *in_stack_ffffffffffffff38;
  sqvector<SQExceptionTrap> *this_01;
  long local_98;
  long local_90;
  long local_88;
  SQObjectPtr local_78;
  ulong local_68;
  SQObjectValue local_60;
  ulong local_58;
  SQObjectValue local_50;
  sqvector<SQExceptionTrap> local_38;
  long local_20;
  SQVM *local_18;
  bool local_1;
  
  if (*(int *)(in_RDI + 0xb8) == 1) {
    SQVM::Raise_Error(in_RSI,"internal vm error, yielding dead generator");
    local_1 = false;
  }
  else if (*(int *)(in_RDI + 0xb8) == 2) {
    SQVM::Raise_Error(in_RSI,"internal vm error, yielding a dead generator");
    local_1 = false;
  }
  else {
    val = (SQExceptionTrap *)(in_RSI->_top - in_RSI->_stackbase);
    this_00 = (CallInfo *)(in_RDI + 0x40);
    this_01 = &local_38;
    local_38._allocated = (SQUnsignedInteger)val;
    local_20 = in_RDX;
    local_18 = in_RSI;
    ::SQObjectPtr::SQObjectPtr((SQObjectPtr *)this_01);
    sqvector<SQObjectPtr>::resize
              ((sqvector<SQObjectPtr> *)this_01,(SQUnsignedInteger)val,(SQObjectPtr *)this_00);
    ::SQObjectPtr::~SQObjectPtr((SQObjectPtr *)this_00);
    pSVar1 = sqvector<SQObjectPtr>::operator[](&local_18->_stack,local_18->_stackbase);
    local_68 = *(ulong *)&pSVar1->super_SQObject;
    local_60 = (pSVar1->super_SQObject)._unVal;
    bVar3 = (local_68 & 0x8000000) != 0;
    local_58 = local_68;
    local_50 = local_60;
    if (bVar3) {
      x = SQRefCounted::GetWeakRef
                    ((SQRefCounted *)this_00,
                     (SQObjectType)((ulong)in_stack_ffffffffffffff38 >> 0x20));
      ::SQObjectPtr::SQObjectPtr(&local_78,x);
      local_68 = local_78.super_SQObject._0_8_;
      local_60 = local_78.super_SQObject._unVal;
    }
    ::SQObjectPtr::operator=((SQObjectPtr *)this_01,(SQObject *)val);
    if (bVar3) {
      ::SQObjectPtr::~SQObjectPtr((SQObjectPtr *)this_00);
    }
    for (local_88 = 1; local_88 < local_20; local_88 = local_88 + 1) {
      sqvector<SQObjectPtr>::operator[](&local_18->_stack,local_18->_stackbase + local_88);
      ::SQObjectPtr::operator=((SQObjectPtr *)this_01,(SQObjectPtr *)val);
    }
    for (local_90 = 0; local_90 < (long)local_38._allocated; local_90 = local_90 + 1) {
      sqvector<SQObjectPtr>::operator[](&local_18->_stack,local_18->_stackbase + local_90);
      ::SQObjectPtr::Null((SQObjectPtr *)this_00);
    }
    SQVM::CallInfo::operator=(this_00,in_stack_ffffffffffffff38);
    *(undefined8 *)(in_RDI + 0x78) = 0;
    for (local_98 = 0; local_98 < *(int *)(in_RDI + 0x80); local_98 = local_98 + 1) {
      sqvector<SQExceptionTrap>::top(&local_18->_etraps);
      sqvector<SQExceptionTrap>::push_back(this_01,val);
      sqvector<SQExceptionTrap>::pop_back(&local_18->_etraps);
      pSVar2 = sqvector<SQExceptionTrap>::back((sqvector<SQExceptionTrap> *)(in_RDI + 0xa0));
      pSVar2->_stackbase = pSVar2->_stackbase - local_18->_stackbase;
      pSVar2->_stacksize = pSVar2->_stacksize - local_18->_stackbase;
    }
    *(undefined4 *)(in_RDI + 0xb8) = 1;
    local_1 = true;
  }
  return local_1;
}

Assistant:

bool SQGenerator::Yield(SQVM *v,SQInteger target)
{
    if(_state==eSuspended) { v->Raise_Error(_SC("internal vm error, yielding dead generator"));  return false;}
    if(_state==eDead) { v->Raise_Error(_SC("internal vm error, yielding a dead generator")); return false; }
    SQInteger size = v->_top-v->_stackbase;

    _stack.resize(size);
    SQObject _this = v->_stack[v->_stackbase];
    _stack._vals[0] = ISREFCOUNTED(type(_this)) ? SQObjectPtr(_refcounted(_this)->GetWeakRef(type(_this))) : _this;
    for(SQInteger n =1; n<target; n++) {
        _stack._vals[n] = v->_stack[v->_stackbase+n];
    }
    for(SQInteger j =0; j < size; j++)
    {
        v->_stack[v->_stackbase+j].Null();
    }

    _ci = *v->ci;
    _ci._generator=NULL;
    for(SQInteger i=0;i<_ci._etraps;i++) {
        _etraps.push_back(v->_etraps.top());
        v->_etraps.pop_back();
        // store relative stack base and size in case of resume to other _top
        SQExceptionTrap &et = _etraps.back();
        et._stackbase -= v->_stackbase;
        et._stacksize -= v->_stackbase;
    }
    _state=eSuspended;
    return true;
}